

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::AsioHost::WorkerLoop(AsioHost *this)

{
  bool bVar1;
  error_code ec;
  LogStringBuffer buffer;
  error_code *in_stack_fffffffffffffcb8;
  LogStringBuffer *in_stack_fffffffffffffcc0;
  OutputWorker *in_stack_fffffffffffffcc8;
  error_code *in_stack_fffffffffffffcd8;
  error_code *peVar2;
  LogStringBuffer *in_stack_fffffffffffffcf8;
  OutputWorker *in_stack_fffffffffffffd00;
  string local_2f8 [32];
  error_code local_2d8;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  error_code *local_58;
  string *local_50;
  undefined1 *local_48;
  error_code *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  error_code *local_18;
  char *local_10;
  undefined1 *local_8;
  
  std::error_code::error_code((error_code *)in_stack_fffffffffffffcc0);
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffcc8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x20922d);
    asio::io_context::run((io_context *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    bVar1 = std::error_code::operator_cast_to_bool(&local_2d8);
    if (bVar1) {
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffcd8);
      local_2b0 = &ModuleLogger;
      local_2b8 = "Worker loop context error: ";
      local_2c0 = local_2f8;
      local_290 = &ModuleLogger;
      local_294 = 3;
      local_2a0 = "Worker loop context error: ";
      local_280 = &ModuleLogger;
      local_284 = 3;
      local_2a8 = local_2c0;
      if (DAT_00329338 < 4) {
        local_c8 = &ModuleLogger;
        local_cc = 3;
        local_d8 = "Worker loop context error: ";
        local_e0 = local_2c0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8,Trace);
        local_b0 = &DAT_00329368;
        local_a0 = &ModuleLogger;
        local_a8 = local_268;
        local_b8 = local_d8;
        local_c0 = local_e0;
        peVar2 = (error_code *)&ModuleLogger;
        local_88 = &ModuleLogger;
        local_98 = local_b0;
        local_90 = local_a8;
        local_80 = local_b0;
        local_78 = local_a8;
        std::operator<<(aoStack_258,(string *)&DAT_00329368);
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        local_20 = local_a8;
        local_28 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        in_stack_fffffffffffffcd8 = peVar2;
        local_58 = peVar2;
        local_18 = peVar2;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_48 = local_60;
        local_50 = local_70;
        local_30 = local_60;
        local_38 = local_70;
        local_40 = peVar2;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        in_stack_fffffffffffffcc8 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x20959e);
      }
      std::__cxx11::string::~string(local_2f8);
    }
  }
  return;
}

Assistant:

void AsioHost::WorkerLoop()
{
    asio::error_code ec;

    while (!Terminated)
    {
        Context->run(ec);

        if (ec) {
            ModuleLogger.Warning("Worker loop context error: ", ec.message());
        }
    }
}